

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O2

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *
CfdTestGenerateUtxo(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__return_storage_ptr__,
                   NetType net_type,HDWallet *wallet,string *base_path,Amount *amount,
                   uint32_t offset,uint32_t count,
                   vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *privkey_list)

{
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d10;
  ByteData256 txid_bytes;
  string path;
  string local_cc0;
  Address local_ca0;
  KeyData key;
  Descriptor desc;
  UtxoData utxo;
  DescriptorScriptReference ref;
  
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__val = 1; __val - (int)amount != 1; __val = __val + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wallet,"/");
    std::__cxx11::to_string((string *)&ref,__val);
    std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    std::__cxx11::string::~string((string *)&utxo);
    cfd::core::HDWallet::GeneratePrivkeyData
              (&key,(HDWallet *)CONCAT44(in_register_00000034,net_type),kRegtest,&path);
    cfd::UtxoData::UtxoData(&utxo);
    cfd::core::KeyData::ToString_abi_cxx11_((string *)&desc,&key,true,kApostrophe,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ca0,
                   "wpkh(",(string *)&desc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ca0,
                   ")");
    std::__cxx11::string::operator=((string *)&utxo.descriptor,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&desc);
    utxo.amount.ignore_check_ = SUB81(base_path->_M_string_length,0);
    utxo.amount.amount_ = (int64_t)(base_path->_M_dataplus)._M_p;
    cfd::core::Descriptor::Parse
              (&desc,&utxo.descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    cfd::core::Descriptor::GetReference
              (&ref,&desc,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::DescriptorScriptReference::GetLockingScript((Script *)&local_ca0,&ref);
    cfd::core::Script::operator=(&utxo.locking_script,(Script *)&local_ca0);
    cfd::core::Script::~Script((Script *)&local_ca0);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_ca0,&ref,kRegtest);
    cfd::core::Address::operator=(&utxo.address,&local_ca0);
    cfd::core::Address::~Address(&local_ca0);
    utxo.address_type = kP2wpkhAddress;
    cfd::core::HDWallet::GetSeed
              ((ByteData *)&local_d10,(HDWallet *)CONCAT44(in_register_00000034,net_type));
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_cc0,(ByteData *)&local_d10);
    std::operator+(&local_d30,&local_cc0,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ca0,
                   &local_d30,&path);
    cfd::core::HashUtil::Sha256(&txid_bytes,(string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_d30);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d30,&txid_bytes.data_
              );
    cfd::core::Txid::Txid((Txid *)&local_ca0,(ByteData256 *)&local_d30);
    cfd::core::Txid::operator=(&utxo.txid,(Txid *)&local_ca0);
    cfd::core::Txid::~Txid((Txid *)&local_ca0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d30);
    utxo.vout = __val;
    std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
              ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)__return_storage_ptr__,&utxo);
    if ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
        CONCAT44(in_register_0000008c,offset) !=
        (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x0) {
      cfd::core::KeyData::GetPrivkey((Privkey *)&local_ca0,&key);
      std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
      emplace_back<cfd::core::Privkey>
                ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                 CONCAT44(in_register_0000008c,offset),(Privkey *)&local_ca0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_ca0);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txid_bytes);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&ref);
    cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
    cfd::UtxoData::~UtxoData(&utxo);
    cfd::core::KeyData::~KeyData(&key);
    std::__cxx11::string::~string((string *)&path);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<UtxoData> CfdTestGenerateUtxo(
    NetType net_type, const HDWallet& wallet, const std::string& base_path,
    const Amount& amount, uint32_t offset, uint32_t count,
    std::vector<Privkey>* privkey_list) {
  std::vector<UtxoData> list;
  for (uint32_t index=offset; index<(offset + count); ++index) {
    std::string path = base_path + "/" + std::to_string(index);
    auto key = wallet.GeneratePrivkeyData(net_type, path);
    UtxoData utxo;
    utxo.descriptor = "wpkh(" + key.ToString() + ")";
    utxo.amount = amount;
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    utxo.locking_script = ref.GetLockingScript();
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type  = AddressType::kP2wpkhAddress;
    auto txid_bytes = HashUtil::Sha256(wallet.GetSeed().GetHex() + "/" + path);
    utxo.txid = Txid(ByteData256(txid_bytes));
    utxo.vout = index;
    list.emplace_back(utxo);
    if (privkey_list != nullptr) {
      privkey_list->push_back(key.GetPrivkey());
    }
  }
  return list;
}